

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

int slang::ast::TimingControl::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  Compilation *compilation;
  ulong uVar2;
  bool bVar3;
  InvalidTimingControl *pIVar4;
  undefined4 in_register_0000003c;
  Delay3Syntax *syntax;
  SourceRange sourceRange;
  ASTContext ctx;
  ASTContext local_68;
  SourceRange local_28;
  
  syntax = (Delay3Syntax *)CONCAT44(in_register_0000003c,__fd);
  compilation = (Compilation *)**(undefined8 **)__addr;
  if ((__addr[1].sa_family & 0x1800) == 0) {
    bVar3 = ASTContext::inAlwaysCombLatch((ASTContext *)__addr);
    if (!bVar3) {
      local_68.scope.ptr = *(Scope **)__addr;
      local_68._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
      uVar2._0_2_ = __addr[1].sa_family;
      uVar2._2_1_ = __addr[1].sa_data[0];
      uVar2._3_1_ = __addr[1].sa_data[1];
      uVar2._4_1_ = __addr[1].sa_data[2];
      uVar2._5_1_ = __addr[1].sa_data[3];
      uVar2._6_1_ = __addr[1].sa_data[4];
      uVar2._7_1_ = __addr[1].sa_data[5];
      local_68.instanceOrProc = *(Symbol **)(__addr[1].sa_data + 6);
      local_68.firstTempVar = *(TempVarSymbol **)(__addr + 2);
      local_68.randomizeDetails = *(RandomizeDetails **)(__addr[2].sa_data + 6);
      local_68.assertionInstance = *(AssertionInstanceDetails **)(__addr + 3);
      local_68.flags.m_bits = uVar2 | 0x10;
      SVar1 = (syntax->super_TimingControlSyntax).super_SyntaxNode.kind;
      if ((int)SVar1 < 0xbf) {
        if ((int)SVar1 < 0x8c) {
          if (SVar1 == CycleDelay) {
            pIVar4 = (InvalidTimingControl *)
                     CycleDelayControl::fromSyntax(compilation,(DelaySyntax *)syntax,&local_68);
          }
          else {
            pIVar4 = (InvalidTimingControl *)Delay3Control::fromSyntax(compilation,syntax,&local_68)
            ;
          }
        }
        else if (SVar1 == DelayControl) {
          pIVar4 = (InvalidTimingControl *)
                   DelayControl::fromSyntax(compilation,(DelaySyntax *)syntax,&local_68);
        }
        else {
          pIVar4 = (InvalidTimingControl *)
                   SignalEventControl::fromSyntax
                             (compilation,(EventControlSyntax *)syntax,&local_68);
        }
      }
      else if ((int)SVar1 < 0x14f) {
        if (SVar1 == EventControlWithExpression) {
          pIVar4 = (InvalidTimingControl *)
                   EventListControl::fromSyntax
                             (compilation,*(SyntaxNode **)&syntax->openParen,&local_68);
        }
        else {
          local_28 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pIVar4 = (InvalidTimingControl *)
                   BumpAllocator::emplace<slang::ast::ImplicitEventControl,slang::SourceRange>
                             ((BumpAllocator *)compilation,&local_28);
        }
      }
      else if (SVar1 == OneStepDelay) {
        local_28 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        pIVar4 = (InvalidTimingControl *)
                 BumpAllocator::emplace<slang::ast::OneStepDelayControl,slang::SourceRange>
                           ((BumpAllocator *)compilation,&local_28);
      }
      else {
        pIVar4 = (InvalidTimingControl *)
                 RepeatedEventControl::fromSyntax
                           (compilation,(RepeatedEventControlSyntax *)syntax,&local_68);
      }
      (pIVar4->super_TimingControl).syntax = (SyntaxNode *)syntax;
      goto LAB_0030ac90;
    }
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag((ASTContext *)__addr,(DiagCode)0x4d0008,sourceRange);
  local_68.scope.ptr = (Scope *)0x0;
  pIVar4 = BumpAllocator::
           emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                     ((BumpAllocator *)compilation,(TimingControl **)&local_68);
LAB_0030ac90:
  return (int)pIVar4;
}

Assistant:

TimingControl& TimingControl::bind(const TimingControlSyntax& syntax, const ASTContext& context) {
    auto& comp = context.getCompilation();
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) || context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badCtrl(comp, nullptr);
    }

    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    TimingControl* result;
    switch (syntax.kind) {
        case SyntaxKind::DelayControl:
            result = &DelayControl::fromSyntax(comp, syntax.as<DelaySyntax>(), ctx);
            break;
        case SyntaxKind::Delay3:
            result = &Delay3Control::fromSyntax(comp, syntax.as<Delay3Syntax>(), ctx);
            break;
        case SyntaxKind::EventControl:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<EventControlSyntax>(), ctx);
            break;
        case SyntaxKind::EventControlWithExpression:
            result = &EventListControl::fromSyntax(
                comp, *syntax.as<EventControlWithExpressionSyntax>().expr, ctx);
            break;
        case SyntaxKind::ImplicitEventControl:
            result = &ImplicitEventControl::fromSyntax(comp,
                                                       syntax.as<ImplicitEventControlSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::RepeatedEventControl:
            result = &RepeatedEventControl::fromSyntax(comp,
                                                       syntax.as<RepeatedEventControlSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::OneStepDelay:
            result = comp.emplace<OneStepDelayControl>(syntax.sourceRange());
            break;
        case SyntaxKind::CycleDelay:
            result = &CycleDelayControl::fromSyntax(comp, syntax.as<DelaySyntax>(), ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}